

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::indexToCoordinatesTest<false>(ViewTest *this)

{
  long *plVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  outit;
  long *plVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  outit_00;
  ulong *puVar3;
  ulong *puVar4;
  ulong uVar5;
  size_t sVar6;
  allocator_type local_b9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> d;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 4;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,(CoordinateOrder *)&c,
             (CoordinateOrder *)&d,&local_b9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&c,3,(allocator_type *)&d);
  puVar3 = (ulong *)CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_);
  puVar3[2] = 0;
  uVar5 = 0;
  sVar6 = 0;
  puVar4 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (uVar5 < puVar4[2]) {
    puVar3[1] = 0;
    uVar5 = 0;
    while (uVar5 < puVar4[1]) {
      *puVar3 = 0;
      uVar5 = *puVar3;
      while (uVar5 < *puVar4) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,3,
                   (allocator_type *)&local_b9);
        outit._M_current._4_4_ =
             d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_;
        outit._M_current._0_4_ =
             d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start._0_4_;
        andres::View<int,false,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar6,outit);
        plVar2 = (long *)CONCAT44(d.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  d.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_);
        plVar1 = (long *)CONCAT44(c.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  c.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_);
        if ((*plVar2 == *plVar1) && (plVar2[1] == plVar1[1])) {
          local_b9 = (allocator_type)(plVar2[2] == plVar1[2]);
        }
        else {
          local_b9 = (allocator_type)0x0;
        }
        test((bool *)&local_b9);
        sVar6 = sVar6 + 1;
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        puVar3 = (ulong *)CONCAT44(c.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   c.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_);
        uVar5 = *puVar3 + 1;
        *puVar3 = uVar5;
        puVar4 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar5 = puVar3[1] + 1;
      puVar3[1] = uVar5;
    }
    uVar5 = puVar3[2] + 1;
    puVar3[2] = uVar5;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 4;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,(CoordinateOrder *)&c,
             (CoordinateOrder *)&d,&local_b9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&c,3,(allocator_type *)&d);
  puVar3 = (ulong *)CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_);
  *puVar3 = 0;
  uVar5 = 0;
  sVar6 = 0;
  puVar4 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (uVar5 < *puVar4) {
    puVar3[1] = 0;
    uVar5 = 0;
    while (uVar5 < puVar4[1]) {
      puVar3[2] = 0;
      uVar5 = puVar3[2];
      while (uVar5 < puVar4[2]) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,3,
                   (allocator_type *)&local_b9);
        outit_00._M_current._4_4_ =
             d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_;
        outit_00._M_current._0_4_ =
             d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start._0_4_;
        andres::View<int,false,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar6,outit_00);
        plVar2 = (long *)CONCAT44(d.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  d.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_);
        plVar1 = (long *)CONCAT44(c.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  c.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_);
        if ((*plVar2 == *plVar1) && (plVar2[1] == plVar1[1])) {
          local_b9 = (allocator_type)(plVar2[2] == plVar1[2]);
        }
        else {
          local_b9 = (allocator_type)0x0;
        }
        test((bool *)&local_b9);
        sVar6 = sVar6 + 1;
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&d.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        puVar3 = (ulong *)CONCAT44(c.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   c.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_);
        uVar5 = puVar3[2] + 1;
        puVar3[2] = uVar5;
        puVar4 = shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      uVar5 = puVar3[1] + 1;
      puVar3[1] = uVar5;
    }
    uVar5 = *puVar3 + 1;
    *puVar3 = uVar5;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::indexToCoordinatesTest() {
    // internalFirstMajorOrder == false
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[2]=0; c[2]<shape[2]; ++c[2]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[0]=0; c[0]<shape[0]; ++c[0]) {
            std::vector<std::size_t> d(3);
            v.indexToCoordinates(index, d.begin());
            test(d[0] == c[0] && d[1] == c[1] && d[2] == c[2]);
            ++index;
        }
    }
    // internalFirstMajorOrder == true
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::vector<std::size_t> d(3);
            v.indexToCoordinates(index, d.begin());
            test(d[0] == c[0] && d[1] == c[1] && d[2] == c[2]);
            ++index;
        }
    }
}